

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void * parse_xor(Parser *parser)

{
  Token *op;
  BinaryExpr *left;
  void *right;
  
  left = (BinaryExpr *)parse_and(parser);
  while (op = parser->token, op->kind == XOR) {
    move(parser);
    right = parse_and(parser);
    left = new_binary_expr(left,op,right);
  }
  return left;
}

Assistant:

void *parse_xor(Parser *parser) {
    void *left = parse_and(parser);
    Token *tok = token(parser);
    while (token(parser)->kind == XOR) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_and(parser));
    }
    return left;
}